

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O3

void __thiscall
llvm::DWARFUnit::getInlinedChainForAddress
          (DWARFUnit *this,uint64_t Address,SmallVectorImpl<llvm::DWARFDie> *InlinedChain)

{
  bool bVar1;
  element_type *this_00;
  DWARFDie local_30;
  
  if ((InlinedChain->super_SmallVectorTemplateBase<llvm::DWARFDie,_true>).
      super_SmallVectorTemplateCommon<llvm::DWARFDie,_void>.super_SmallVectorBase.Size != 0) {
    __assert_fail("InlinedChain.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFUnit.cpp"
                  ,0x28a,
                  "void llvm::DWARFUnit::getInlinedChainForAddress(uint64_t, SmallVectorImpl<DWARFDie> &)"
                 );
  }
  parseDWO(this);
  this_00 = (this->DWO).super___shared_ptr<llvm::DWARFUnit,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 == (element_type *)0x0) {
    this_00 = this;
  }
  local_30 = getSubroutineForAddress(this_00,Address);
  if (local_30.Die != (DWARFDebugInfoEntry *)0x0 && local_30.U != (DWARFUnit *)0x0) {
    bVar1 = DWARFDie::isSubprogramDIE(&local_30);
    if (!bVar1) {
      do {
        if ((local_30.U == (DWARFUnit *)0x0) || (local_30.Die == (DWARFDebugInfoEntry *)0x0)) {
          __assert_fail("isValid() && \"must check validity prior to calling\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/DebugInfo/DWARF/DWARFDie.h"
                        ,0x3b,
                        "const DWARFAbbreviationDeclaration *llvm::DWARFDie::getAbbreviationDeclarationPtr() const"
                       );
        }
        if (((local_30.Die)->AbbrevDecl != (DWARFAbbreviationDeclaration *)0x0) &&
           ((local_30.Die)->AbbrevDecl->Tag == DW_TAG_inlined_subroutine)) {
          SmallVectorTemplateBase<llvm::DWARFDie,_true>::push_back
                    (&InlinedChain->super_SmallVectorTemplateBase<llvm::DWARFDie,_true>,&local_30);
        }
        local_30 = DWARFDie::getParent(&local_30);
        bVar1 = DWARFDie::isSubprogramDIE(&local_30);
      } while (!bVar1);
    }
    SmallVectorTemplateBase<llvm::DWARFDie,_true>::push_back
              (&InlinedChain->super_SmallVectorTemplateBase<llvm::DWARFDie,_true>,&local_30);
  }
  return;
}

Assistant:

void
DWARFUnit::getInlinedChainForAddress(uint64_t Address,
                                     SmallVectorImpl<DWARFDie> &InlinedChain) {
  assert(InlinedChain.empty());
  // Try to look for subprogram DIEs in the DWO file.
  parseDWO();
  // First, find the subroutine that contains the given address (the leaf
  // of inlined chain).
  DWARFDie SubroutineDIE =
      (DWO ? *DWO : *this).getSubroutineForAddress(Address);

  if (!SubroutineDIE)
    return;

  while (!SubroutineDIE.isSubprogramDIE()) {
    if (SubroutineDIE.getTag() == DW_TAG_inlined_subroutine)
      InlinedChain.push_back(SubroutineDIE);
    SubroutineDIE  = SubroutineDIE.getParent();
  }
  InlinedChain.push_back(SubroutineDIE);
}